

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O0

void flatbuffers::tests::Offset64SizePrefix(void)

{
  bool expval;
  Offset<flatbuffers::String> OVar1;
  size_t buffer_minalign;
  uint8_t *puVar2;
  unsigned_long expval_00;
  SizeT SVar3;
  RootTable *this;
  String *this_00;
  char *expval_01;
  RootTable *root_table;
  Verifier verifier;
  Options options;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> local_f0;
  Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_> local_e4;
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_> local_e0;
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_> local_d8;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> local_d0;
  Offset<flatbuffers::String> local_c4;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> local_c0;
  Offset64<flatbuffers::String> local_b8;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_b0;
  offset_type local_a8;
  Offset<RootTable> root_table_offset;
  undefined1 local_90 [4];
  Offset<flatbuffers::String> near_string_offset;
  FlatBufferBuilder64 builder;
  
  buffer_minalign = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<true>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<true> *)local_90,0x400,(Allocator *)0x0,false,buffer_minalign);
  OVar1 = FlatBufferBuilderImpl<true>::CreateString<flatbuffers::Offset>
                    ((FlatBufferBuilderImpl<true> *)local_90,"some near string");
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset64(&local_b0,0);
  Offset64<flatbuffers::String>::Offset64(&local_b8,0);
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>::Offset64(&local_c0,0);
  local_c4 = OVar1;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>::Offset64(&local_d0,0);
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_>::Offset64(&local_d8,0);
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_>::Offset64(&local_e0,0);
  Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_>::Offset(&local_e4,0)
  ;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>::Offset64(&local_f0,0);
  local_a8 = (offset_type)
             CreateRootTable((FlatBufferBuilder64 *)local_90,local_b0,0,local_b8,local_c0,local_c4,
                             local_d0,local_d8,local_e0,local_e4,local_f0);
  FinishSizePrefixedRootTableBuffer((FlatBufferBuilder64 *)local_90,(Offset<RootTable>)local_a8);
  puVar2 = FlatBufferBuilderImpl<true>::GetBufferPointer((FlatBufferBuilderImpl<true> *)local_90);
  expval_00 = GetPrefixedSize<unsigned_long>(puVar2);
  SVar3 = FlatBufferBuilderImpl<true>::GetSize((FlatBufferBuilderImpl<true> *)local_90);
  TestEq<unsigned_long,unsigned_long>
            (expval_00,SVar3 - 8,
             "\'GetPrefixedSize<uoffset64_t>(builder.GetBufferPointer())\' != \'builder.GetSize() - sizeof(uoffset64_t)\'"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x163,"");
  VerifierTemplate<false>::Options::Options((Options *)&verifier.flex_reuse_tracker_);
  std::numeric_limits<long>::max();
  puVar2 = FlatBufferBuilderImpl<true>::GetBufferPointer((FlatBufferBuilderImpl<true> *)local_90);
  SVar3 = FlatBufferBuilderImpl<true>::GetSize((FlatBufferBuilderImpl<true> *)local_90);
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)&root_table,puVar2,SVar3,
             (Options *)&verifier.flex_reuse_tracker_);
  expval = VerifySizePrefixedRootTableBuffer((Verifier *)&root_table);
  TestEq<bool,bool>(expval,true,"\'VerifySizePrefixedRootTableBuffer(verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0x16c,"");
  puVar2 = FlatBufferBuilderImpl<true>::GetBufferPointer((FlatBufferBuilderImpl<true> *)local_90);
  this = GetSizePrefixedRootTable(puVar2);
  this_00 = RootTable::near_string(this);
  expval_01 = String::c_str(this_00);
  TestEqStr(expval_01,"some near string",
            "\'root_table->near_string()->c_str()\' != \'\"some near string\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
            ,0x172,"");
  FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl((FlatBufferBuilderImpl<true> *)local_90);
  return;
}

Assistant:

void Offset64SizePrefix() {
  FlatBufferBuilder64 builder;

  // First serialize a nested buffer.
  const Offset<String> near_string_offset =
      builder.CreateString("some near string");

  // Finish by building the root table by passing in all the offsets.
  const Offset<RootTable> root_table_offset =
      CreateRootTable(builder, 0, 0, 0, 0, near_string_offset, 0);

  // Finish the buffer.
  FinishSizePrefixedRootTableBuffer(builder, root_table_offset);

  TEST_EQ(GetPrefixedSize<uoffset64_t>(builder.GetBufferPointer()),
          builder.GetSize() - sizeof(uoffset64_t));

  Verifier::Options options;
  // Allow the verifier to verify 64-bit buffers.
  options.max_size = FLATBUFFERS_MAX_64_BUFFER_SIZE;
  options.assert = true;

  Verifier verifier(builder.GetBufferPointer(), builder.GetSize(), options);

  TEST_EQ(VerifySizePrefixedRootTableBuffer(verifier), true);

  const RootTable *root_table =
      GetSizePrefixedRootTable(builder.GetBufferPointer());

  // Verify the fields.
  TEST_EQ_STR(root_table->near_string()->c_str(), "some near string");
}